

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O0

void __thiscall MyServerConnection::OnConnect(MyServerConnection *this)

{
  bool bVar1;
  SDKResult SVar2;
  element_type *peVar3;
  element_type *in_RDI;
  int i_1;
  int i;
  uint8_t incompressible_b [200];
  uint8_t incompressible_a [100];
  uint8_t data [5];
  uint8_t data_1 [5];
  TonkStatus cs;
  shared_ptr<MyServerConnection> *connection;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *__range1;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus status;
  LogStringBuffer buffer;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  SDKResult in_stack_fffffffffffff998;
  SDKResult in_stack_fffffffffffff99c;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *in_stack_fffffffffffff9a0;
  LogStringBuffer *this_00;
  SDKConnectionList<MyServerConnection> *in_stack_fffffffffffff9d8;
  Channel *buffer_00;
  int local_600;
  int local_5fc;
  char local_5f8 [208];
  undefined1 local_528 [108];
  TonkResult local_4bc;
  undefined1 local_4b5;
  uint8_t local_4b4 [4];
  TonkResult local_4b0;
  undefined1 local_4a9;
  uint8_t local_4a8 [20];
  uint local_494 [5];
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> *local_480;
  shared_ptr<MyServerConnection> *local_478;
  __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
  local_470;
  undefined1 *local_468;
  undefined1 local_460 [28];
  uint local_444 [7];
  char *local_428;
  uint *local_420;
  char *local_418;
  uint *local_410;
  char *local_408;
  Channel *local_400;
  char *local_3f8;
  uint *local_3f0;
  char *local_3e8;
  uint *local_3e0;
  char *local_3d8;
  undefined4 local_3cc;
  Channel *local_3c8;
  undefined4 local_3bc;
  Channel *local_3b8;
  ostream aoStack_390 [32];
  SDKConnection *in_stack_fffffffffffffc90;
  
  test::LogTonkStatus(in_stack_fffffffffffffc90);
  tonk::SDKConnection::GetStatus
            ((SDKConnection *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  tonk::SDKConnectionList<MyServerConnection>::GetList(in_stack_fffffffffffff9d8);
  local_468 = local_460;
  local_470._M_current =
       (shared_ptr<MyServerConnection> *)
       std::
       vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
       ::begin(in_stack_fffffffffffff988);
  local_478 = (shared_ptr<MyServerConnection> *)
              std::
              vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
              ::end(in_stack_fffffffffffff988);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                       (__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                        *)in_stack_fffffffffffff988);
    if (!bVar1) break;
    local_480 = &__gnu_cxx::
                 __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                 ::operator*(&local_470)->
                 super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x103b2a);
    tonk::SDKConnection::GetStatus
              ((SDKConnection *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    peVar3 = std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_480);
    if (peVar3 != in_RDI) {
      local_410 = local_494;
      local_420 = local_444;
      local_400 = &Logger;
      local_408 = "Broadcasting connection ";
      local_418 = " about ";
      local_428 = " connecting";
      local_3c8 = &Logger;
      local_3cc = 2;
      local_3d8 = "Broadcasting connection ";
      local_3e8 = " about ";
      local_3f8 = " connecting";
      local_3b8 = &Logger;
      local_3bc = 2;
      local_3f0 = local_420;
      local_3e0 = local_410;
      if ((int)Logger.ChannelMinLevel < 3) {
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                   (char *)in_stack_fffffffffffff988,Trace);
        buffer_00 = &Logger;
        std::operator<<(aoStack_390,(string *)&Logger.Prefix);
        std::operator<<(aoStack_390,"Broadcasting connection ");
        this_00 = (LogStringBuffer *)buffer_00;
        std::ostream::operator<<(aoStack_390,local_494[0]);
        std::operator<<(aoStack_390," about ");
        std::ostream::operator<<(aoStack_390,local_444[0]);
        std::operator<<(aoStack_390," connecting");
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,(LogStringBuffer *)buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1041e6);
      }
      local_4a9 = 3;
      tonk::WriteU32_LE(local_4a8,local_444[0]);
      std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x104217);
      in_stack_fffffffffffff99c =
           tonk::SDKConnection::Send
                     ((SDKConnection *)
                      CONCAT44(in_stack_fffffffffffff99c.Result,in_stack_fffffffffffff998.Result),
                      (void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      (uint64_t)in_stack_fffffffffffff988,0);
      local_4b0 = in_stack_fffffffffffff99c.Result;
    }
    local_4b5 = 3;
    tonk::WriteU32_LE(local_4b4,local_494[0]);
    in_stack_fffffffffffff998 =
         tonk::SDKConnection::Send
                   ((SDKConnection *)
                    CONCAT44(in_stack_fffffffffffff99c.Result,in_stack_fffffffffffff998.Result),
                    (void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                    (uint64_t)in_stack_fffffffffffff988,0);
    local_4bc = in_stack_fffffffffffff998.Result;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
    ::operator++(&local_470);
  }
  for (local_5fc = 0; local_5fc < 100; local_5fc = local_5fc + 1) {
    local_528[local_5fc] = (char)local_5fc;
  }
  for (local_600 = 0; local_600 < 200; local_600 = local_600 + 1) {
    local_5f8[local_600] = -0x38 - (char)local_600;
  }
  SVar2 = tonk::SDKConnection::Send
                    ((SDKConnection *)
                     CONCAT44(in_stack_fffffffffffff99c.Result,in_stack_fffffffffffff998.Result),
                     (void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                     (uint64_t)in_stack_fffffffffffff988,0);
  tonk::SDKConnection::Send
            ((SDKConnection *)
             CONCAT44(in_stack_fffffffffffff99c.Result,in_stack_fffffffffffff998.Result),
             (void *)CONCAT44(SVar2.Result,in_stack_fffffffffffff990),
             (uint64_t)in_stack_fffffffffffff988,0);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(in_stack_fffffffffffff9a0);
  return;
}

Assistant:

void MyServerConnection::OnConnect()
{
    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Server->ConnectionList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();

        if (connection.get() != this)
        {
            Logger.Info("Broadcasting connection ", cs.LocallyAssignedIdForRemoteHost,
                " about ", status.LocallyAssignedIdForRemoteHost, " connecting");

            uint8_t data[1 + 4];
            data[0] = ID_ConnectionAdded;
            tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
            connection->Send(data, sizeof(data), TonkChannel_Reliable0);
        }

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionAdded;
        tonk::WriteU32_LE(data + 1, cs.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }

    // Send two buffers in quick succession in unused channels.
    // The goal is to get the Flush() function to insert a sync
    // frame between these two buffers to test this rare case.
    static const int kBytesA = 100;
    static const int kBytesB = 200;
    uint8_t incompressible_a[kBytesA];
    uint8_t incompressible_b[kBytesB];
    for (int i = 0; i < kBytesA; ++i) {
        incompressible_a[i] = (uint8_t)(i);
    }
    for (int i = 0; i < kBytesB; ++i) {
        incompressible_b[i] = (uint8_t)(kBytesB - i);
    }
    Send(incompressible_a, kBytesA, TonkChannel_LowPri0 + 5);
    Send(incompressible_b, kBytesB, TonkChannel_Reliable0 + 5);
}